

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void wallet::coinselector_tests::add_coin
               (CAmount *nValue,int nInput,
               vector<wallet::COutput,_std::allocator<wallet::COutput>_> *set)

{
  reference __args_1;
  long in_FS_OFFSET;
  int local_c8;
  bool local_c1;
  int local_c0;
  bool local_bb;
  bool local_ba;
  bool local_b9;
  int local_b8 [2];
  CMutableTransaction tx;
  Txid local_78;
  COutPoint local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&tx);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,(long)(nInput + 1));
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[nInput].nValue = *nValue;
  tx.nLockTime = nextLockTime;
  nextLockTime = nextLockTime + 1;
  CMutableTransaction::GetHash(&local_78,&tx);
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
       local_78.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
  local_58.n = nInput;
  __args_1 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(&tx.vout,(long)nInput);
  local_b8[1] = 1;
  local_b8[0] = -1;
  local_b9 = true;
  local_ba = true;
  local_c0 = 0;
  local_bb = true;
  local_c1 = false;
  local_c8 = 0;
  std::vector<wallet::COutput,std::allocator<wallet::COutput>>::
  emplace_back<COutPoint,CTxOut&,int,int,bool,bool,bool,int,bool,int>
            ((vector<wallet::COutput,std::allocator<wallet::COutput>> *)set,&local_58,__args_1,
             local_b8 + 1,local_b8,&local_b9,&local_ba,&local_bb,&local_c0,&local_c1,&local_c8);
  CMutableTransaction::~CMutableTransaction(&tx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void add_coin(const CAmount& nValue, int nInput, std::vector<COutput>& set)
{
    CMutableTransaction tx;
    tx.vout.resize(nInput + 1);
    tx.vout[nInput].nValue = nValue;
    tx.nLockTime = nextLockTime++;        // so all transactions get different hashes
    set.emplace_back(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ -1, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, /*fees=*/ 0);
}